

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O2

size_t ra_portable_deserialize_size(char *buf,size_t maxbytes)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  ushort *puVar8;
  ulong uVar9;
  
  if (3 < maxbytes) {
    uVar2 = *(uint *)buf;
    if (uVar2 == 0x303a || (uVar2 & 0xffff) == 0x303b) {
      if ((uVar2 & 0xffff) == 0x303b) {
        uVar9 = (ulong)((uVar2 >> 0x10) + 8 >> 3);
        uVar3 = uVar9 + 4;
        if (maxbytes < uVar3) {
          return 0;
        }
        pcVar7 = buf + 4;
        uVar4 = (uVar2 >> 0x10) + 1;
        pcVar6 = pcVar7 + uVar9;
      }
      else {
        if (maxbytes < 8) {
          return 0;
        }
        uVar4 = *(uint *)(buf + 4);
        pcVar7 = (char *)0x0;
        if (0x10000 < (int)uVar4) {
          return 0;
        }
        pcVar6 = buf + 8;
        uVar3 = 8;
      }
      uVar3 = uVar3 + (long)(int)(uVar4 * 2) * 2;
      if (uVar3 <= maxbytes) {
        puVar8 = (ushort *)(pcVar6 + (long)(int)(uVar4 * 2) * 2);
        if (((uVar2 & 0xffff) != 0x303b) || (3 < (int)uVar4)) {
          uVar3 = uVar3 + (long)(int)(uVar4 * 4);
          if (maxbytes < uVar3) {
            return 0;
          }
          puVar8 = (ushort *)((long)puVar8 + (long)(int)(uVar4 * 4));
        }
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        uVar9 = 0;
        do {
          if (uVar4 == uVar9) {
            return uVar3;
          }
          uVar1 = *(ushort *)(pcVar6 + uVar9 * 4 + 2);
          if ((uVar2 & 0xffff) == 0x303b) {
            uVar5 = 1 << ((byte)uVar9 & 7) & (uint)(byte)pcVar7[uVar9 >> 3 & 0x1fffffff];
            if ((uVar5 == 0) && (0xfff < uVar1)) goto LAB_0010b0f1;
            if (uVar5 == 0) goto LAB_0010b123;
            if (maxbytes < uVar3 + 2) {
              return 0;
            }
            uVar3 = uVar3 + 2 + (ulong)*puVar8 * 4;
            if (maxbytes < uVar3) {
              return 0;
            }
            puVar8 = puVar8 + (ulong)*puVar8 * 2 + 1;
          }
          else if (uVar1 < 0x1000) {
LAB_0010b123:
            uVar3 = uVar3 + (ulong)uVar1 * 2 + 2;
            if (maxbytes < uVar3) {
              return 0;
            }
            puVar8 = puVar8 + (ulong)uVar1 + 1;
          }
          else {
LAB_0010b0f1:
            uVar3 = uVar3 + 0x2000;
            if (maxbytes < uVar3) {
              return 0;
            }
            puVar8 = puVar8 + 0x1000;
          }
          uVar9 = uVar9 + 1;
        } while( true );
      }
    }
  }
  return 0;
}

Assistant:

size_t ra_portable_deserialize_size(const char *buf, const size_t maxbytes) {
    size_t bytestotal = sizeof(int32_t);  // for cookie
    if (bytestotal > maxbytes) return 0;
    uint32_t cookie;
    memcpy(&cookie, buf, sizeof(int32_t));
    buf += sizeof(uint32_t);
    if ((cookie & 0xFFFF) != SERIAL_COOKIE &&
        cookie != SERIAL_COOKIE_NO_RUNCONTAINER) {
        return 0;
    }
    int32_t size;

    if ((cookie & 0xFFFF) == SERIAL_COOKIE)
        size = (cookie >> 16) + 1;
    else {
        bytestotal += sizeof(int32_t);
        if (bytestotal > maxbytes) return 0;
        memcpy(&size, buf, sizeof(int32_t));
        buf += sizeof(uint32_t);
    }
    if (size > (1 << 16)) {
        return 0;
    }
    char *bitmapOfRunContainers = NULL;
    bool hasrun = (cookie & 0xFFFF) == SERIAL_COOKIE;
    if (hasrun) {
        int32_t s = (size + 7) / 8;
        bytestotal += s;
        if (bytestotal > maxbytes) return 0;
        bitmapOfRunContainers = (char *)buf;
        buf += s;
    }
    bytestotal += size * 2 * sizeof(uint16_t);
    if (bytestotal > maxbytes) return 0;
    uint16_t *keyscards = (uint16_t *)buf;
    buf += size * 2 * sizeof(uint16_t);
    if ((!hasrun) || (size >= NO_OFFSET_THRESHOLD)) {
        // skipping the offsets
        bytestotal += size * 4;
        if (bytestotal > maxbytes) return 0;
        buf += size * 4;
    }
    // Reading the containers
    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2 * k + 1, sizeof(tmp));
        uint32_t thiscard = tmp + 1;
        bool isbitmap = (thiscard > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((bitmapOfRunContainers[k / 8] & (1 << (k % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }
        if (isbitmap) {
            size_t containersize =
                BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            bytestotal += containersize;
            if (bytestotal > maxbytes) return 0;
            buf += containersize;
        } else if (isrun) {
            bytestotal += sizeof(uint16_t);
            if (bytestotal > maxbytes) return 0;
            uint16_t n_runs;
            memcpy(&n_runs, buf, sizeof(uint16_t));
            buf += sizeof(uint16_t);
            size_t containersize = n_runs * sizeof(rle16_t);
            bytestotal += containersize;
            if (bytestotal > maxbytes) return 0;
            buf += containersize;
        } else {
            size_t containersize = thiscard * sizeof(uint16_t);
            bytestotal += containersize;
            if (bytestotal > maxbytes) return 0;
            buf += containersize;
        }
    }
    return bytestotal;
}